

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_layout_set_min_row_height(nk_context *ctx,float height)

{
  nk_panel *pnVar1;
  
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
     (pnVar1 = ctx->current->layout, pnVar1 != (nk_panel *)0x0)) {
    (pnVar1->row).min_height = height;
  }
  return;
}

Assistant:

NK_API void
nk_layout_set_min_row_height(struct nk_context *ctx, float height)
{
struct nk_window *win;
struct nk_panel *layout;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return;

win = ctx->current;
layout = win->layout;
layout->row.min_height = height;
}